

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_c92d48::HandleReadElfCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  StringEntry *pSVar4;
  string_view value;
  string_view value_00;
  string_view value_01;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string rpath;
  _Any_data local_128;
  _Manager_type local_118;
  pointer ppStack_110;
  pointer local_108;
  pointer ppStack_100;
  cmELF elf;
  string local_d0;
  Arguments arguments;
  cmAlphaNum local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x80) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rpath,"READ_ELF must be called with at least three additional arguments.",
               (allocator<char> *)&arguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&rpath);
    bVar2 = false;
  }
  else {
    if ((anonymous_namespace)::
        HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::parser == '\0') {
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser);
      if (iVar3 != 0) {
        local_108 = (pointer)0x0;
        ppStack_100 = (pointer)0x0;
        local_118 = (_Manager_type)0x0;
        ppStack_110 = (pointer)0x0;
        local_128._M_unused._M_object = (void *)0x0;
        local_128._8_8_ = (_Manager_type)0x0;
        rpath.field_2._M_allocated_capacity = 0;
        rpath.field_2._8_8_ = 0;
        rpath._M_dataplus._M_p = (pointer)0x0;
        rpath._M_string_length = 0;
        name.super_string_view._M_str = "RPATH";
        name.super_string_view._M_len = 5;
        cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                    *)&rpath,name,0);
        name_00.super_string_view._M_str = "RUNPATH";
        name_00.super_string_view._M_len = 7;
        cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                    *)&rpath,name_00,0x20);
        name_01.super_string_view._M_str = "CAPTURE_ERROR";
        name_01.super_string_view._M_len = 0xd;
        cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<(anonymous_namespace)::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                    *)&rpath,name_01,0x40);
        ArgumentParser::ActionMap::ActionMap
                  ((ActionMap *)&HandleReadElfCommand::parser,(ActionMap *)&rpath);
        ArgumentParser::ActionMap::~ActionMap((ActionMap *)&rpath);
        __cxa_atexit(ArgumentParser::Base::~Base,&HandleReadElfCommand::parser,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::
                             HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::parser);
      }
    }
    local_50.View_._M_str =
         (char *)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
    local_50.View_._M_len =
         (size_t)((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 2);
    arguments.RPath._M_dataplus._M_p = (pointer)&arguments.RPath.field_2;
    arguments.RPath._M_string_length = 0;
    arguments.RPath.field_2._M_local_buf[0] = '\0';
    arguments.RunPath._M_dataplus._M_p = (pointer)&arguments.RunPath.field_2;
    arguments.RunPath._M_string_length = 0;
    arguments.RunPath.field_2._M_local_buf[0] = '\0';
    arguments.Error._M_dataplus._M_p = (pointer)&arguments.Error.field_2;
    arguments.Error._M_string_length = 0;
    arguments.Error.field_2._M_local_buf[0] = '\0';
    rpath._M_dataplus._M_p = (pointer)&HandleReadElfCommand::parser;
    rpath._M_string_length = 0;
    rpath.field_2._M_allocated_capacity = 0;
    rpath.field_2._8_8_ = &arguments;
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = (_Manager_type)0x0;
    local_118 = (_Manager_type)0x0;
    ppStack_110 = (pointer)0x0;
    local_108 = (pointer)((ulong)local_108 & 0xffffffffffffff00);
    ArgumentParser::Instance::
    Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((Instance *)&rpath,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&local_50,0);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    bVar2 = cmsys::SystemTools::FileExists(pbVar1 + 1,true);
    if (bVar2) {
      cmELF::cmELF(&elf,pbVar1[1]._M_dataplus._M_p);
      bVar2 = cmELF::Valid(&elf);
      if (bVar2) {
        if (arguments.RPath._M_string_length != 0) {
          pSVar4 = cmELF::GetRPath(&elf);
          if (pSVar4 != (StringEntry *)0x0) {
            std::__cxx11::string::string((string *)&rpath,(string *)pSVar4);
            local_50.View_._M_len = CONCAT71(local_50.View_._M_len._1_7_,0x3a);
            local_d0._M_dataplus._M_p._0_1_ = 0x3b;
            std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )rpath._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(rpath._M_dataplus._M_p + rpath._M_string_length),(char *)&local_50,
                       (char *)&local_d0);
            value._M_str = rpath._M_dataplus._M_p;
            value._M_len = rpath._M_string_length;
            cmMakefile::AddDefinition(status->Makefile,&arguments.RPath,value);
            std::__cxx11::string::~string((string *)&rpath);
          }
        }
        bVar2 = true;
        if (arguments.RunPath._M_string_length != 0) {
          pSVar4 = cmELF::GetRunPath(&elf);
          if (pSVar4 != (StringEntry *)0x0) {
            std::__cxx11::string::string((string *)&rpath,(string *)pSVar4);
            local_50.View_._M_len = CONCAT71(local_50.View_._M_len._1_7_,0x3a);
            local_d0._M_dataplus._M_p._0_1_ = 0x3b;
            std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )rpath._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(rpath._M_dataplus._M_p + rpath._M_string_length),(char *)&local_50,
                       (char *)&local_d0);
            value_00._M_str = rpath._M_dataplus._M_p;
            value_00._M_len = rpath._M_string_length;
            cmMakefile::AddDefinition(status->Makefile,&arguments.RunPath,value_00);
            std::__cxx11::string::~string((string *)&rpath);
          }
        }
      }
      else if (arguments.Error._M_string_length == 0) {
        rpath._M_dataplus._M_p = (pointer)0x17;
        rpath._M_string_length = (size_type)anon_var_dwarf_cb202c;
        local_50.View_._M_str = pbVar1[1]._M_dataplus._M_p;
        local_50.View_._M_len = pbVar1[1]._M_string_length;
        cmStrCat<char[31]>(&local_d0,(cmAlphaNum *)&rpath,&local_50,
                           (char (*) [31])"\nthat is not a valid ELF file.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&local_d0);
        bVar2 = false;
      }
      else {
        bVar2 = true;
        value_01._M_str = "not a valid ELF file";
        value_01._M_len = 0x14;
        cmMakefile::AddDefinition(status->Makefile,&arguments.Error,value_01);
      }
      cmELF::~cmELF(&elf);
    }
    else {
      rpath._M_dataplus._M_p = (pointer)0x15;
      rpath._M_string_length = (size_type)anon_var_dwarf_cb201f;
      local_50.View_._M_str = pbVar1[1]._M_dataplus._M_p;
      local_50.View_._M_len = pbVar1[1]._M_string_length;
      cmStrCat<char[23]>((string *)&elf,(cmAlphaNum *)&rpath,&local_50,
                         (char (*) [23])"\" that does not exist.");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&elf);
      bVar2 = false;
    }
    HandleReadElfCommand::Arguments::~Arguments(&arguments);
  }
  return bVar2;
}

Assistant:

bool HandleReadElfCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("READ_ELF must be called with at least three additional "
                    "arguments.");
    return false;
  }

  std::string const& fileNameArg = args[1];

  struct Arguments
  {
    std::string RPath;
    std::string RunPath;
    std::string Error;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("RPATH"_s, &Arguments::RPath)
                               .Bind("RUNPATH"_s, &Arguments::RunPath)
                               .Bind("CAPTURE_ERROR"_s, &Arguments::Error);
  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(2),
                                           /*unparsedArguments=*/nullptr);

  if (!cmSystemTools::FileExists(fileNameArg, true)) {
    status.SetError(cmStrCat("READ_ELF given FILE \"", fileNameArg,
                             "\" that does not exist."));
    return false;
  }

  cmELF elf(fileNameArg.c_str());
  if (!elf) {
    if (arguments.Error.empty()) {
      status.SetError(cmStrCat("READ_ELF given FILE:\n  ", fileNameArg,
                               "\nthat is not a valid ELF file."));
      return false;
    }
    status.GetMakefile().AddDefinition(arguments.Error,
                                       "not a valid ELF file");
    return true;
  }

  if (!arguments.RPath.empty()) {
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      std::string rpath(se_rpath->Value);
      std::replace(rpath.begin(), rpath.end(), ':', ';');
      status.GetMakefile().AddDefinition(arguments.RPath, rpath);
    }
  }
  if (!arguments.RunPath.empty()) {
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      std::string runpath(se_runpath->Value);
      std::replace(runpath.begin(), runpath.end(), ':', ';');
      status.GetMakefile().AddDefinition(arguments.RunPath, runpath);
    }
  }

  return true;
}